

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,char *cend)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  bool bVar1;
  Value *__y;
  reference ppVar2;
  bool local_299;
  Value *value;
  _Base_ptr local_260;
  undefined1 local_258 [8];
  value_type defaultValue;
  _Self local_218;
  _Self local_210;
  iterator it;
  CZString actualKey;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream oss;
  int local_28;
  char *cend_local;
  char *key_local;
  Value *this_local;
  
  if (((*(ushort *)&this->field_0x8 & 0xff) != 0) && ((*(ushort *)&this->field_0x8 & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,
                    "in Json::Value::resolveReference(key, end): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1d0);
  }
  if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
    Value((Value *)&actualKey.field_1.storage_,objectValue);
    operator=(this,(Value *)&actualKey.field_1.storage_);
    ~Value((Value *)&actualKey.field_1.storage_);
  }
  local_28 = (int)cend;
  CZString::CZString((CZString *)&it,key,local_28 - (int)key,duplicateOnCopy);
  local_210._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::lower_bound((this->value_).map_,(CZString *)&it);
  local_218._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((this->value_).map_);
  bVar1 = std::operator!=(&local_210,&local_218);
  local_299 = false;
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_210);
    local_299 = CZString::operator==(&ppVar2->first,(CZString *)&it);
  }
  if (local_299 == false) {
    __y = nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)local_258,(CZString *)&it,__y);
    this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
               *)(this->value_).map_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
               &value,&local_210);
    local_260 = (_Base_ptr)
                std::
                map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                          (this_00,(const_iterator)value,
                           (pair<const_Json::Value::CZString,_Json::Value> *)local_258);
    local_210._M_node = local_260;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_210);
    defaultValue.second.limit_._4_4_ = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair
              ((pair<const_Json::Value::CZString,_Json::Value> *)local_258);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       (&local_210);
    defaultValue.second.limit_._4_4_ = 1;
  }
  this_local = &ppVar2->second;
  CZString::~CZString((CZString *)&it);
  return this_local;
}

Assistant:

Value& Value::resolveReference(char const* key, char const* cend)
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(key, end): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
  CZString actualKey(
      key, static_cast<unsigned>(cend-key), CZString::duplicateOnCopy);
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}